

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

void __thiscall
cmFileAPI::BuildClientRequestInternalTest
          (cmFileAPI *this,ClientRequest *r,
          vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *versions)

{
  pointer pRVar1;
  unsigned_long uVar2;
  string local_30;
  
  pRVar1 = (versions->
           super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pRVar1 == (versions->
                  super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
LAB_0031bea7:
      if ((r->super_Object).Version == 0) {
        NoSupportedVersion_abi_cxx11_(&local_30,(cmFileAPI *)versions,versions);
        std::__cxx11::string::operator=((string *)&r->Error,(string *)&local_30);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p != &local_30.field_2) {
          operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
        }
      }
      return;
    }
    if (pRVar1->Major == 1 && pRVar1->Minor < 4) {
      uVar2 = 1;
LAB_0031bea3:
      (r->super_Object).Version = uVar2;
      goto LAB_0031bea7;
    }
    if (pRVar1->Major == 2 && pRVar1->Minor == 0) {
      uVar2 = 2;
      goto LAB_0031bea3;
    }
    pRVar1 = pRVar1 + 1;
  } while( true );
}

Assistant:

void cmFileAPI::BuildClientRequestInternalTest(
  ClientRequest& r, std::vector<RequestVersion> const& versions)
{
  // Select a known version from those requested.
  for (RequestVersion const& v : versions) {
    if ((v.Major == 1 && v.Minor <= InternalTestV1Minor) || //
        (v.Major == 2 && v.Minor <= InternalTestV2Minor)) {
      r.Version = v.Major;
      break;
    }
  }
  if (!r.Version) {
    r.Error = NoSupportedVersion(versions);
  }
}